

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O0

void __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::insert_path(RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
              *this,RBPath *path,K value)

{
  bool bVar1;
  bool bVar2;
  ChildRef CVar3;
  K KVar4;
  undefined8 in_RDX;
  RBPath *in_RSI;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *in_RDI;
  K child_p;
  K child_g;
  K sibling;
  K grand_parent;
  K parent;
  K curr;
  bool curr_dir;
  RBPath *in_stack_fffffffffffffdb8;
  RBPath *in_stack_fffffffffffffdc0;
  undefined1 uVar5;
  K in_stack_fffffffffffffdc8;
  K in_stack_fffffffffffffdd0;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *in_stack_fffffffffffffde0;
  ChildRef in_stack_fffffffffffffe10;
  undefined1 new_is_red;
  Contents in_stack_fffffffffffffe18;
  H local_78;
  undefined8 local_70;
  H local_68;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_60;
  H local_58;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_50;
  H local_48;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_40;
  H local_38;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_30;
  H local_28;
  RBPath *local_18;
  undefined8 local_8;
  
  local_18 = in_RSI;
  local_8 = in_RDX;
  local_28.val = (uintptr_t *)RBPath::curr(in_stack_fffffffffffffdb8);
  ChildRef::operator=((ChildRef *)in_stack_fffffffffffffdc8.unsafe_capptr,in_stack_fffffffffffffdd0)
  ;
  local_30 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)0x0;
  local_48.val = (uintptr_t *)RBPath::curr(in_stack_fffffffffffffdb8);
  local_40 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                          ((ChildRef *)in_stack_fffffffffffffdb8);
  local_38.val = (uintptr_t *)
                 get_dir(SUB81((ulong)in_stack_fffffffffffffdc0 >> 0x38,0),in_stack_fffffffffffffdc8
                        );
  ChildRef::operator=((ChildRef *)in_stack_fffffffffffffdc8.unsafe_capptr,in_stack_fffffffffffffdd0)
  ;
  local_50 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)0x0;
  local_68.val = (uintptr_t *)RBPath::curr(in_stack_fffffffffffffdb8);
  local_60 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                          ((ChildRef *)in_stack_fffffffffffffdb8);
  local_58.val = (uintptr_t *)
                 get_dir(SUB81((ulong)in_stack_fffffffffffffdc0 >> 0x38,0),in_stack_fffffffffffffdc8
                        );
  ChildRef::operator=((ChildRef *)in_stack_fffffffffffffdc8.unsafe_capptr,in_stack_fffffffffffffdd0)
  ;
  local_70 = local_8;
  BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  ::set_red(in_stack_fffffffffffffe18,SUB81((ulong)in_stack_fffffffffffffe10.ptr.val >> 0x38,0));
  debug_log(in_stack_fffffffffffffde0,(char *)in_RDI,
            (RBPath *)in_stack_fffffffffffffdd0.unsafe_capptr);
  while( true ) {
    local_78.val = (uintptr_t *)RBPath::curr(in_stack_fffffffffffffdb8);
    CVar3 = get_root((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                      *)in_stack_fffffffffffffdb8);
    bVar1 = ChildRef::operator!=((ChildRef *)&local_78,CVar3);
    uVar5 = (undefined1)((ulong)in_stack_fffffffffffffe10.ptr.val >> 0x38);
    if (!bVar1) {
      CVar3 = get_root((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                        *)in_stack_fffffffffffffdb8);
      snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffdb8);
      BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
      ::set_red(in_stack_fffffffffffffe18,(bool)uVar5);
      invariant((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                 *)CVar3.ptr.val);
      return;
    }
    RBPath::parent(in_stack_fffffffffffffdb8);
    snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffdb8);
    bVar1 = BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            ::is_red((Contents)in_stack_fffffffffffffdd0.unsafe_capptr);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    bVar1 = RBPath::curr_dir((RBPath *)0x31087e);
    RBPath::curr(in_stack_fffffffffffffdb8);
    snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffdb8);
    RBPath::parent(in_stack_fffffffffffffdb8);
    snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffdb8);
    RBPath::grand_parent(in_stack_fffffffffffffdb8);
    KVar4 = snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                      ((ChildRef *)in_stack_fffffffffffffdb8);
    bVar2 = RBPath::parent_dir((RBPath *)0x310912);
    uVar5 = (undefined1)((ulong)in_stack_fffffffffffffdc0 >> 0x38);
    new_is_red = (undefined1)((ulong)in_stack_fffffffffffffe10.ptr.val >> 0x38);
    if (bVar2 == bVar1) {
      in_stack_fffffffffffffdc8.unsafe_capptr =
           (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)local_18;
      CVar3 = RBPath::grand_parent(in_stack_fffffffffffffdb8);
      debug_log(in_RDI,"Insert - double red case 1",
                (RBPath *)in_stack_fffffffffffffdc8.unsafe_capptr,CVar3);
      get_dir(SUB81((ulong)in_stack_fffffffffffffdc0 >> 0x38,0),in_stack_fffffffffffffdc8);
      snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffdb8);
      BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
      ::set_red(in_stack_fffffffffffffe18,SUB81((ulong)in_stack_fffffffffffffe10.ptr.val >> 0x38,0))
      ;
      get_dir(SUB81((ulong)in_stack_fffffffffffffdc0 >> 0x38,0),in_stack_fffffffffffffdc8);
      ChildRef::operator=((ChildRef *)in_stack_fffffffffffffdc8.unsafe_capptr,
                          in_stack_fffffffffffffdd0);
      get_dir(SUB81((ulong)in_stack_fffffffffffffdc0 >> 0x38,0),in_stack_fffffffffffffdc8);
      ChildRef::operator=((ChildRef *)in_stack_fffffffffffffdc8.unsafe_capptr,
                          in_stack_fffffffffffffdd0);
      RBPath::grand_parent(in_stack_fffffffffffffdb8);
      ChildRef::operator=((ChildRef *)in_stack_fffffffffffffdc8.unsafe_capptr,
                          in_stack_fffffffffffffdd0);
      in_stack_fffffffffffffdd0.unsafe_capptr =
           (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)local_18;
      CVar3 = RBPath::grand_parent(in_stack_fffffffffffffdb8);
      debug_log(in_RDI,"Insert - double red case 1 - done",
                (RBPath *)in_stack_fffffffffffffdd0.unsafe_capptr,CVar3);
    }
    else {
      in_stack_fffffffffffffdb8 = local_18;
      CVar3 = RBPath::grand_parent(local_18);
      debug_log(in_RDI,"Insert - double red case 2",in_stack_fffffffffffffdb8,CVar3);
      get_dir((bool)uVar5,in_stack_fffffffffffffdc8);
      snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffdb8);
      get_dir((bool)uVar5,in_stack_fffffffffffffdc8);
      snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffdb8);
      BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
      ::set_red(in_stack_fffffffffffffe18,(bool)new_is_red);
      RBPath::grand_parent(in_stack_fffffffffffffdb8);
      ChildRef::operator=((ChildRef *)in_stack_fffffffffffffdc8.unsafe_capptr,
                          in_stack_fffffffffffffdd0);
      get_dir((bool)uVar5,in_stack_fffffffffffffdc8);
      ChildRef::operator=((ChildRef *)in_stack_fffffffffffffdc8.unsafe_capptr,
                          in_stack_fffffffffffffdd0);
      get_dir((bool)uVar5,in_stack_fffffffffffffdc8);
      ChildRef::operator=((ChildRef *)in_stack_fffffffffffffdc8.unsafe_capptr,
                          in_stack_fffffffffffffdd0);
      get_dir((bool)uVar5,in_stack_fffffffffffffdc8);
      ChildRef::operator=((ChildRef *)in_stack_fffffffffffffdc8.unsafe_capptr,
                          in_stack_fffffffffffffdd0);
      get_dir((bool)uVar5,in_stack_fffffffffffffdc8);
      ChildRef::operator=((ChildRef *)in_stack_fffffffffffffdc8.unsafe_capptr,
                          in_stack_fffffffffffffdd0);
      in_stack_fffffffffffffdc0 = local_18;
      in_stack_fffffffffffffe10 = RBPath::grand_parent(in_stack_fffffffffffffdb8);
      debug_log(in_RDI,"Insert - double red case 2 - done",in_stack_fffffffffffffdc0,
                in_stack_fffffffffffffe10);
      in_stack_fffffffffffffe18.unsafe_capptr = KVar4.unsafe_capptr;
    }
    RBPath::pop(local_18);
    RBPath::pop(local_18);
    RBPath::curr(in_stack_fffffffffffffdb8);
    KVar4 = snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                      ((ChildRef *)in_stack_fffffffffffffdb8);
    invariant(in_RDI,KVar4,
              (K)(FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                  *)0x0,
              (K)(FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                  *)0x0);
  }
  invariant(in_stack_fffffffffffffde0);
  return;
}

Assistant:

void insert_path(RBPath& path, K value)
    {
      SNMALLOC_ASSERT(path.curr().is_null());
      path.curr() = value;
      get_dir(true, path.curr()) = Rep::null;
      get_dir(false, path.curr()) = Rep::null;
      Rep::set_red(value, true);

      debug_log("Insert ", path);

      // Propogate double red up to rebalance.
      // These notes were particularly clear for explaining insert
      // https://www.cs.cmu.edu/~fp/courses/15122-f10/lectures/17-rbtrees.pdf
      while (path.curr() != get_root())
      {
        SNMALLOC_ASSERT(Rep::is_red(path.curr()));
        if (!Rep::is_red(path.parent()))
        {
          invariant();
          return;
        }
        bool curr_dir = path.curr_dir();
        K curr = path.curr();
        K parent = path.parent();
        K grand_parent = path.grand_parent();
        SNMALLOC_ASSERT(!Rep::is_red(grand_parent));
        if (path.parent_dir() == curr_dir)
        {
          debug_log("Insert - double red case 1", path, path.grand_parent());
          /* Same direction case
           * G - grand parent
           * P - parent
           * C - current
           * S - sibling
           *
           *    G                 P
           *   / \               / \
           *  A   P     -->     G   C
           *     / \           / \
           *    S   C         A   S
           */
          K sibling = get_dir(!curr_dir, parent);
          Rep::set_red(curr, false);
          get_dir(curr_dir, grand_parent) = sibling;
          get_dir(!curr_dir, parent) = grand_parent;
          path.grand_parent() = parent;
          debug_log(
            "Insert - double red case 1 - done", path, path.grand_parent());
        }
        else
        {
          debug_log("Insert - double red case 2", path, path.grand_parent());
          /* G - grand parent
           * P - parent
           * C - current
           * Cg - Current child for grand parent
           * Cp - Current child for parent
           *
           *    G                  C
           *   / \               /   \
           *  A   P             G     P
           *     / \    -->    / \   / \
           *    C   B         A  Cg Cp  B
           *   / \
           *  Cg  Cp
           */
          K child_g = get_dir(curr_dir, curr);
          K child_p = get_dir(!curr_dir, curr);

          Rep::set_red(parent, false);
          path.grand_parent() = curr;
          get_dir(curr_dir, curr) = grand_parent;
          get_dir(!curr_dir, curr) = parent;
          get_dir(curr_dir, parent) = child_p;
          get_dir(!curr_dir, grand_parent) = child_g;
          debug_log(
            "Insert - double red case 2 - done", path, path.grand_parent());
        }

        // Move to what replaced grand parent.
        path.pop();
        path.pop();
        invariant(path.curr());
      }
      Rep::set_red(get_root(), false);
      invariant();
    }